

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

_Bool trans_VDUP(DisasContext_conflict1 *s,arg_VDUP *a)

{
  int reg;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  TCGTemp *pTVar2;
  _Bool _Var3;
  uint32_t oprsz;
  uintptr_t o;
  TCGv_i32 var;
  uint vece;
  
  if ((((s->features & 0x100) == 0) ||
      ((tcg_ctx = s->uc->tcg_ctx, (s->isar->mvfr0 & 0xe) == 0 && ((a->vn & 0x10) != 0)))) ||
     ((a->b != 0 && (a->e != 0)))) {
LAB_0065ff31:
    _Var3 = false;
  }
  else {
    if (a->q == 0) {
      oprsz = 8;
    }
    else {
      oprsz = 0x10;
      if ((a->vn & 1) != 0) goto LAB_0065ff31;
    }
    vece = 0;
    if (a->b == 0) {
      vece = (a->e == 0) + 1;
    }
    _Var1 = full_vfp_access_check(s,false);
    _Var3 = true;
    if (_Var1) {
      reg = a->rt;
      s_00 = s->uc->tcg_ctx;
      pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      var = (TCGv_i32)((long)pTVar2 - (long)s_00);
      load_reg_var(s,var,reg);
      tcg_gen_gvec_dup_i32_aarch64
                (tcg_ctx,vece,(a->vn & 0xfffffffeU) * 0x80 + (a->vn & 1U) * 8 + 0xc10,oprsz,oprsz,
                 var);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
    }
  }
  return _Var3;
}

Assistant:

static bool trans_VDUP(DisasContext *s, arg_VDUP *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* VDUP (general purpose register) */
    TCGv_i32 tmp;
    int size, vec_size;

    if (!arm_dc_feature(s, ARM_FEATURE_NEON)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vn & 0x10)) {
        return false;
    }

    if (a->b && a->e) {
        return false;
    }

    if (a->q && (a->vn & 1)) {
        return false;
    }

    vec_size = a->q ? 16 : 8;
    if (a->b) {
        size = 0;
    } else if (a->e) {
        size = 1;
    } else {
        size = 2;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = load_reg(s, a->rt);
    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(a->vn, 0),
                         vec_size, vec_size, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);

    return true;
}